

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O3

void * reader_worker(void *param)

{
  uint uVar1;
  uint *puVar2;
  long lVar3;
  uint uVar4;
  
  if (*(int *)((long)param + 0x60) == 0) {
    do {
      puVar2 = (uint *)(**(code **)((long)param + 0x38))(param);
      if (puVar2 == (uint *)0x0) {
        return (void *)0x0;
      }
      uVar1 = *(uint *)((long)param + 0x68);
      *puVar2 = uVar1;
      *(uint **)(*(long *)((long)param + 0x70) + (ulong)uVar1 * 8) = puVar2;
      *(uint *)((long)param + 0x68) = uVar1 + 1;
      uVar4 = *(uint *)((long)param + 100);
      if (uVar1 + 1 < uVar4) {
        if (*(long *)((long)param + 0x70) == 0) {
          _mpp_log_l(2,"mpi_dec_utils","Assertion %s failed at %s:%d\n",0,"impl->slots",
                     "add_new_slot",100);
          if ((DAT_001142e3 & 0x10) != 0) goto LAB_0010659e;
          uVar4 = *(uint *)((long)param + 100);
        }
LAB_0010654f:
        if ((uVar4 <= *(uint *)((long)param + 0x68)) &&
           (_mpp_log_l(2,"mpi_dec_utils","Assertion %s failed at %s:%d\n",0,
                       "impl->slot_cnt < impl->slot_max","add_new_slot",0x65),
           (DAT_001142e3 & 0x10) != 0)) {
LAB_0010659e:
          abort();
        }
      }
      else {
        lVar3 = mpp_osal_realloc("add_new_slot",*(long *)((long)param + 0x70),
                                 (ulong)(uVar4 * 2) << 3);
        *(long *)((long)param + 0x70) = lVar3;
        if (lVar3 != 0) {
          uVar4 = *(int *)((long)param + 100) * 2;
          *(uint *)((long)param + 100) = uVar4;
          goto LAB_0010654f;
        }
      }
    } while (puVar2[6] == 0 && *(int *)((long)param + 0x60) == 0);
  }
  return (void *)0x0;
}

Assistant:

static void* reader_worker(void *param)
{
    FileReaderImpl *impl = (FileReaderImpl*)param;
    RK_U32 eos = 0;

    while (!impl->thd_stop && !eos) {
        FileBufSlot *slot = impl->read_func(impl);

        if (NULL == slot)
            break;

        add_new_slot(impl, slot);
        eos = slot->eos;
    }

    return NULL;
}